

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_decoder.c
# Opt level: O3

lzma_ret block_decode(lzma_coder_conflict11 *coder,lzma_allocator *allocator,uint8_t *in,
                     size_t *in_pos,size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,
                     lzma_action action)

{
  anon_enum_32_conflict1 aVar1;
  lzma_check type;
  size_t sVar2;
  size_t sVar3;
  lzma_block *plVar4;
  lzma_vli lVar5;
  lzma_bool lVar6;
  lzma_ret lVar7;
  uint32_t uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong size;
  
  aVar1 = coder->sequence;
  if (aVar1 == SEQ_CODE) {
    sVar2 = *in_pos;
    sVar3 = *out_pos;
    lVar7 = (*(coder->next).code)
                      ((coder->next).coder,allocator,in,in_pos,in_size,out,out_pos,out_size,action);
    uVar10 = coder->compressed_size;
    uVar12 = coder->compressed_limit;
    if (0x7ffffffffffffffe < uVar12) {
      uVar12 = 0x7fffffffffffffff;
    }
    if (uVar12 - uVar10 < *in_pos - sVar2 || uVar12 < uVar10) {
      return LZMA_DATA_ERROR;
    }
    size = *out_pos - sVar3;
    coder->compressed_size = uVar10 + (*in_pos - sVar2);
    uVar10 = coder->uncompressed_size;
    uVar12 = coder->block->uncompressed_size;
    uVar11 = 0x7fffffffffffffff;
    if (uVar12 < 0x7fffffffffffffff) {
      uVar11 = uVar12;
    }
    if (uVar11 - uVar10 < size || uVar11 < uVar10) {
      return LZMA_DATA_ERROR;
    }
    coder->uncompressed_size = uVar10 + size;
    lzma_check_update(&coder->check,coder->block->check,out + sVar3,size);
    if (lVar7 != LZMA_STREAM_END) {
      return lVar7;
    }
    plVar4 = coder->block;
    uVar10 = coder->compressed_size;
    if (plVar4->compressed_size != 0xffffffffffffffff && plVar4->compressed_size != uVar10) {
      return LZMA_DATA_ERROR;
    }
    lVar5 = coder->uncompressed_size;
    if (plVar4->uncompressed_size != 0xffffffffffffffff && plVar4->uncompressed_size != lVar5) {
      return LZMA_DATA_ERROR;
    }
    plVar4->compressed_size = uVar10;
    plVar4->uncompressed_size = lVar5;
    coder->sequence = SEQ_PADDING;
  }
  else {
    if (aVar1 == SEQ_CHECK) goto LAB_004709ef;
    if (aVar1 != SEQ_PADDING) {
      return LZMA_PROG_ERROR;
    }
    uVar10 = coder->compressed_size;
  }
  while ((uVar10 & 3) != 0) {
    uVar12 = *in_pos;
    if (in_size <= uVar12) {
      return LZMA_OK;
    }
    uVar10 = uVar10 + 1;
    coder->compressed_size = uVar10;
    *in_pos = uVar12 + 1;
    if (in[uVar12] != '\0') {
      return LZMA_DATA_ERROR;
    }
  }
  type = coder->block->check;
  if (type == LZMA_CHECK_NONE) {
    return LZMA_STREAM_END;
  }
  lzma_check_finish(&coder->check,type);
  coder->sequence = SEQ_CHECK;
LAB_004709ef:
  plVar4 = coder->block;
  uVar8 = lzma_check_size(plVar4->check);
  uVar10 = (ulong)uVar8;
  lzma_bufcpy(in,in_pos,in_size,plVar4->raw_check,&coder->check_pos,uVar10);
  if (coder->check_pos < uVar10) {
    return LZMA_OK;
  }
  plVar4 = coder->block;
  lVar6 = lzma_check_is_supported(plVar4->check);
  if ((lVar6 != '\0') && (iVar9 = bcmp(plVar4->raw_check,&coder->check,uVar10), iVar9 != 0)) {
    return LZMA_DATA_ERROR;
  }
  return LZMA_STREAM_END;
}

Assistant:

static lzma_ret
block_decode(lzma_coder *coder, lzma_allocator *allocator,
		const uint8_t *LZMA_RESTRICT in, size_t *LZMA_RESTRICT in_pos,
		size_t in_size, uint8_t *LZMA_RESTRICT out,
		size_t *LZMA_RESTRICT out_pos, size_t out_size, lzma_action action)
{
	switch (coder->sequence) {
	case SEQ_CODE: {
		const size_t in_start = *in_pos;
		const size_t out_start = *out_pos;

		const lzma_ret ret = coder->next.code(coder->next.coder,
				allocator, in, in_pos, in_size,
				out, out_pos, out_size, action);

		const size_t in_used = *in_pos - in_start;
		const size_t out_used = *out_pos - out_start;

		// NOTE: We compare to compressed_limit here, which prevents
		// the total size of the Block growing past LZMA_VLI_MAX.
		if (update_size(&coder->compressed_size, in_used,
					coder->compressed_limit)
				|| update_size(&coder->uncompressed_size,
					out_used,
					coder->block->uncompressed_size))
			return LZMA_DATA_ERROR;

		lzma_check_update(&coder->check, coder->block->check,
				out + out_start, out_used);

		if (ret != LZMA_STREAM_END)
			return ret;

		// Compressed and Uncompressed Sizes are now at their final
		// values. Verify that they match the values given to us.
		if (!is_size_valid(coder->compressed_size,
					coder->block->compressed_size)
				|| !is_size_valid(coder->uncompressed_size,
					coder->block->uncompressed_size))
			return LZMA_DATA_ERROR;

		// Copy the values into coder->block. The caller
		// may use this information to construct Index.
		coder->block->compressed_size = coder->compressed_size;
		coder->block->uncompressed_size = coder->uncompressed_size;

		coder->sequence = SEQ_PADDING;
	}

	// Fall through

	case SEQ_PADDING:
		// Compressed Data is padded to a multiple of four bytes.
		while (coder->compressed_size & 3) {
			if (*in_pos >= in_size)
				return LZMA_OK;

			// We use compressed_size here just get the Padding
			// right. The actual Compressed Size was stored to
			// coder->block already, and won't be modified by
			// us anymore.
			++coder->compressed_size;

			if (in[(*in_pos)++] != 0x00)
				return LZMA_DATA_ERROR;
		}

		if (coder->block->check == LZMA_CHECK_NONE)
			return LZMA_STREAM_END;

		lzma_check_finish(&coder->check, coder->block->check);
		coder->sequence = SEQ_CHECK;

	// Fall through

	case SEQ_CHECK: {
		const size_t check_size = lzma_check_size(coder->block->check);
		lzma_bufcpy(in, in_pos, in_size, coder->block->raw_check,
				&coder->check_pos, check_size);
		if (coder->check_pos < check_size)
			return LZMA_OK;

		// Validate the Check only if we support it.
		// coder->check.buffer may be uninitialized
		// when the Check ID is not supported.
		if (lzma_check_is_supported(coder->block->check)
				&& memcmp(coder->block->raw_check,
					coder->check.buffer.u8,
					check_size) != 0)
			return LZMA_DATA_ERROR;

		return LZMA_STREAM_END;
	}
	}

	return LZMA_PROG_ERROR;
}